

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O3

Node * __thiscall
Parser::parseClass(Parser *this,Token *class_token,bool expect_class_name,bool is_local)

{
  pointer *pppNVar1;
  pointer *ppEVar2;
  TokenType TVar3;
  iterator __position;
  pointer pTVar4;
  pointer pTVar5;
  Token *pTVar6;
  bool bVar7;
  Node *pNVar8;
  undefined7 in_register_00000009;
  int iVar9;
  long lVar10;
  TokenType TVar11;
  iterator iVar12;
  CompilationContext *ctx_;
  ulong uVar13;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  Node *member;
  Node *memberValue;
  vector<Node_*,_std::allocator<Node_*>_> classMembers;
  Node *memberName;
  Node *extends;
  Node *className;
  Node *local_88;
  Node *local_80;
  Node **local_78;
  iterator iStack_70;
  Node **local_68;
  Node *local_58;
  Node *local_50;
  NodeType local_44;
  Node *local_40;
  Token *local_38;
  
  local_78 = (Node **)((ulong)local_78 & 0xffffffff00000000);
  __position._M_current =
       (this->expressionContext).
       super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->expressionContext).
      super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>::
    _M_realloc_insert<Parser::ExpressionContext>
              (&this->expressionContext,__position,(ExpressionContext *)&local_78);
  }
  else {
    *__position._M_current = EC_USUAL;
    (this->expressionContext).
    super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  local_40 = (Node *)0x0;
  local_50 = (Node *)0x0;
  local_68 = (Node **)0x0;
  local_78 = (Node **)0x0;
  iStack_70._M_current = (Node **)0x0;
  if (expect_class_name) {
    local_40 = parseDeref(this);
  }
  iVar9 = this->pos;
  pTVar4 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar4[iVar9].type == TK_EXTENDS) {
    this->tok = pTVar4 + iVar9;
    this->pos = iVar9 + 1;
    local_50 = parseTernaryOp(this);
  }
  checkBraceIdentationStyle(this);
  expect(this,TK_LBRACE);
  local_44 = (NodeType)CONCAT71(in_register_00000009,is_local);
  ctx_ = this->ctx;
  local_38 = class_token;
  if (ctx_->isError == false) {
    do {
      iVar9 = this->pos;
      lVar10 = (long)iVar9;
      pTVar5 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar4 = pTVar5 + lVar10;
      TVar3 = pTVar4->type;
      if (TVar3 == TK_SEMICOLON) {
        this->tok = pTVar4;
        this->pos = iVar9 + 1;
        goto LAB_0010fa72;
      }
      if (TVar3 == TK_RBRACE) {
        this->tok = pTVar4;
        this->pos = iVar9 + 1;
        break;
      }
      if (TVar3 == TK_STATIC) {
        this->tok = pTVar4;
        lVar10 = lVar10 + 1;
        iVar9 = (int)lVar10;
        this->pos = iVar9;
        TVar11 = pTVar5[lVar10].type;
LAB_0010f7a2:
        pTVar6 = pTVar5 + lVar10;
        if (TVar11 == TK_LSQUARE) {
          this->tok = pTVar6;
          this->pos = iVar9 + 1;
          pNVar8 = parseTernaryOp(this);
          local_80 = createMakeKeyNode(this,pTVar6,pNVar8);
          expect(this,TK_RSQUARE);
          expect(this,TK_ASSIGN);
          pTVar6 = this->tok;
          local_58 = parseTernaryOp(this);
          pNVar8 = (Node *)operator_new(0x30);
          CompilationContext::Poolable::Poolable((Poolable *)pNVar8,this->ctx);
          pNVar8->tok = pTVar6;
          (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pNVar8->nodeType = (TVar3 == TK_STATIC) + PNT_CLASS_MEMBER;
          local_88 = pNVar8;
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)&pNVar8->children,(iterator)0x0,
                     &local_80);
          iVar12._M_current =
               (local_88->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (local_88->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)&local_88->children,iVar12,&local_58);
          }
          else {
            *iVar12._M_current = local_58;
            pppNVar1 = &(local_88->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppNVar1 = *pppNVar1 + 1;
          }
          if (iStack_70._M_current != local_68) goto LAB_0010fa65;
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)&local_78,iStack_70,&local_88);
        }
        else if (TVar11 == TK_FUNCTION) {
          this->tok = pTVar6;
          this->pos = iVar9 + 1;
          local_80 = parseFunction(this,FT_CLASS_METHOD);
          if (local_80 == (Node *)0x0) {
            local_58 = (Node *)0x0;
          }
          else {
            local_58 = *(local_80->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          }
          pNVar8 = (Node *)operator_new(0x30);
          CompilationContext::Poolable::Poolable((Poolable *)pNVar8,this->ctx);
          pNVar8->tok = pTVar6;
          (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pNVar8->nodeType = (TVar3 == TK_STATIC) + PNT_CLASS_MEMBER;
          local_88 = pNVar8;
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)&pNVar8->children,(iterator)0x0,
                     &local_58);
          iVar12._M_current =
               (local_88->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (local_88->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)&local_88->children,iVar12,&local_80);
          }
          else {
            *iVar12._M_current = local_80;
            pppNVar1 = &(local_88->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppNVar1 = *pppNVar1 + 1;
          }
          if (iStack_70._M_current != local_68) goto LAB_0010fa65;
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)&local_78,iStack_70,&local_88);
        }
        else {
          bVar7 = expect(this,TK_IDENTIFIER);
          if (bVar7) {
            local_80 = createIdentifierNode(this,this->tok);
            expect(this,TK_ASSIGN);
            pTVar6 = this->tok;
            local_58 = parseTernaryOp(this);
            pNVar8 = (Node *)operator_new(0x30);
            CompilationContext::Poolable::Poolable((Poolable *)pNVar8,this->ctx);
            pNVar8->tok = pTVar6;
            (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pNVar8->nodeType = (TVar3 == TK_STATIC) + PNT_CLASS_MEMBER;
            local_88 = pNVar8;
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)&pNVar8->children,(iterator)0x0,
                       &local_80);
            iVar12._M_current =
                 (local_88->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar12._M_current ==
                (local_88->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                        ((vector<Node*,std::allocator<Node*>> *)&local_88->children,iVar12,&local_58
                        );
            }
            else {
              *iVar12._M_current = local_58;
              pppNVar1 = &(local_88->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              *pppNVar1 = *pppNVar1 + 1;
            }
            if (iStack_70._M_current != local_68) goto LAB_0010fa65;
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)&local_78,iStack_70,&local_88);
          }
        }
      }
      else {
        TVar11 = TVar3;
        if (TVar3 != TK_CONSTRUCTOR) goto LAB_0010f7a2;
        this->tok = pTVar4;
        this->pos = iVar9 + 1;
        local_80 = parseFunction(this,FT_CLASS_CONSTRUCTOR);
        local_58 = (Node *)0x0;
        pNVar8 = (Node *)operator_new(0x30);
        CompilationContext::Poolable::Poolable((Poolable *)pNVar8,this->ctx);
        pNVar8->tok = pTVar4;
        (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pNVar8->nodeType = PNT_CLASS_MEMBER;
        local_88 = pNVar8;
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)&pNVar8->children,(iterator)0x0,&local_58)
        ;
        iVar12._M_current =
             (local_88->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (local_88->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)&local_88->children,iVar12,&local_80);
        }
        else {
          *iVar12._M_current = local_80;
          pppNVar1 = &(local_88->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
        if (iStack_70._M_current == local_68) {
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)&local_78,iStack_70,&local_88);
          goto LAB_0010fa72;
        }
LAB_0010fa65:
        *iStack_70._M_current = local_88;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
LAB_0010fa72:
      ctx_ = this->ctx;
    } while (ctx_->isError != true);
  }
  pNVar8 = (Node *)operator_new(0x30);
  CompilationContext::Poolable::Poolable((Poolable *)pNVar8,ctx_);
  pNVar8->tok = local_38;
  this_00 = &pNVar8->children;
  (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar8->nodeType = local_44 & 0xff | PNT_CLASS;
  std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
            ((vector<Node*,std::allocator<Node*>> *)this_00,(iterator)0x0,&local_40);
  iVar12._M_current =
       (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar12._M_current ==
      (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)this_00,iVar12,&local_50);
    iVar12._M_current =
         (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar12._M_current = local_50;
    iVar12._M_current =
         (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current;
  }
  local_80 = (Node *)0x0;
  if (iVar12._M_current ==
      (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*>
              ((vector<Node*,std::allocator<Node*>> *)this_00,iVar12,&local_80);
  }
  else {
    *iVar12._M_current = (Node *)0x0;
    pppNVar1 = &(pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  if (iStack_70._M_current != local_78) {
    lVar10 = 0;
    uVar13 = 0;
    do {
      iVar12._M_current =
           (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          (pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)this_00,iVar12,
                   (Node **)((long)local_78 + lVar10));
      }
      else {
        *iVar12._M_current = *(Node **)((long)local_78 + lVar10);
        pppNVar1 = &(pNVar8->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
      uVar13 = uVar13 + 1;
      lVar10 = lVar10 + 8;
    } while (uVar13 < (ulong)((long)iStack_70._M_current - (long)local_78 >> 3));
  }
  if (local_78 != (Node **)0x0) {
    operator_delete(local_78);
  }
  ppEVar2 = &(this->expressionContext).
             super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppEVar2 = *ppEVar2 + -1;
  return pNVar8;
}

Assistant:

Node * parseClass(Token * class_token, bool expect_class_name, bool is_local)
  {
    EXPRESSION_CONTEXT_SCOPE(EC_USUAL);

    Node * className = nullptr;
    Node * extends = nullptr;
    vector<Node *> classMembers;
    if (expect_class_name)
      className = parseDeref();

    if (accept(TK_EXTENDS))
      extends = parseTernaryOp();

    checkBraceIdentationStyle();
    expect(TK_LBRACE);

    while (!ctx.isError)
    {
      if (accept(TK_RBRACE))
        break;

      if (accept(TK_SEMICOLON))
        continue;

      bool isStatic = accept(TK_STATIC);

      if (!isStatic && accept(TK_CONSTRUCTOR))
      {
        Token * memberTok = tok;
        Node * memberValue = parseFunction(FT_CLASS_CONSTRUCTOR);
        Node * memberName = nullptr;

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
      else if (accept(TK_FUNCTION))
      {
        Token * memberTok = tok;
        Node * memberValue = parseFunction(FT_CLASS_METHOD);
        Node * memberName = memberValue ? memberValue->children[0] : nullptr;

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = isStatic ? PNT_STATIC_CLASS_MEMBER : PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
      else if (accept(TK_LSQUARE))
      {
        Node * memberName = createMakeKeyNode(*tok, parseTernaryOp());
        expect(TK_RSQUARE);
        expect(TK_ASSIGN);
        Token * memberTok = tok;
        Node * memberValue = parseTernaryOp();

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = isStatic ? PNT_STATIC_CLASS_MEMBER : PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
      else if (expect(TK_IDENTIFIER))
      {
        Node * memberName = createIdentifierNode(*tok);
        expect(TK_ASSIGN);
        Token * memberTok = tok;
        Node * memberValue = parseTernaryOp();

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = isStatic ? PNT_STATIC_CLASS_MEMBER : PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
    }

    Node * res = new Node(ctx, *class_token);
    res->nodeType = is_local ? PNT_LOCAL_CLASS : PNT_CLASS;
    res->children.push_back(className);
    res->children.push_back(extends);
    res->children.push_back(nullptr); // attributes (removed code)
    for (size_t i = 0; i < classMembers.size(); i++)
      res->children.push_back(classMembers[i]);
    return res;
  }